

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O2

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::add(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
      *this,Node *node,size_t depth,Box<float> *box,Node **value)

{
  value_type *ppNVar1;
  value_type pNVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  int i;
  Box<float> *extraout_RDX;
  Box<float> *valueBox;
  Box<float> *extraout_RDX_00;
  value_type *child;
  value_type *__x;
  Node *node_00;
  vector<Node_*,_std::allocator<Node_*>_> *pvVar5;
  long lVar6;
  Box<float> local_70;
  Box<float> *local_60;
  Node *local_58;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *local_50;
  vector<Node_*,_std::allocator<Node_*>_> *__range2;
  pointer ppNStack_40;
  pointer local_38;
  
  lVar6._0_4_ = (this->mBox).left;
  lVar6._4_4_ = (this->mBox).top;
  if (lVar6 == 0) {
    if (((Node *)0x7 < node) ||
       ((ulong)(*(long *)&this[1].mBox.width - *(long *)&this[1].mBox) < 0x80)) goto LAB_00101b07;
    local_50 = this + 1;
    valueBox = (Box<float> *)depth;
    local_60 = box;
    local_58 = node;
    for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
      std::make_unique<quadtree::Quadtree<Node*,main::__0,std::equal_to<Node*>,float>::Node>();
      pvVar5 = __range2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = ppNStack_40;
      ___range2 = (Box<float>)(auVar3 << 0x40);
      std::
      __uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
      ::reset((__uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
               *)((long)&(this->mBox).left + lVar6),(pointer)pvVar5);
      std::
      unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
      ::~unique_ptr((unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                     *)&__range2);
      valueBox = extraout_RDX;
    }
    local_38 = (pointer)0x0;
    ___range2 = (Box<float>)ZEXT816(0);
    ppNVar1 = *(value_type **)&this[1].mBox.width;
    for (__x = *(value_type **)&this[1].mBox; __x != ppNVar1; __x = __x + 1) {
      pNVar2 = *__x;
      local_70.left = (pNVar2->box).left;
      local_70.top = (pNVar2->box).top;
      local_70.width = (pNVar2->box).width;
      local_70.height = (pNVar2->box).height;
      uVar4 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                           *)depth,&local_70,valueBox);
      pvVar5 = (vector<Node_*,_std::allocator<Node_*>_> *)&__range2;
      if (uVar4 != 0xffffffff) {
        pvVar5 = (vector<Node_*,_std::allocator<Node_*>_> *)
                 (*(long *)(&(this->mBox).left + (ulong)uVar4 * 2) + 0x20);
      }
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pvVar5,__x);
      valueBox = extraout_RDX_00;
    }
    std::vector<Node_*,_std::allocator<Node_*>_>::_M_move_assign
              ((vector<Node_*,_std::allocator<Node_*>_> *)local_50,
               (_Vector_base<Node_*,_std::allocator<Node_*>_> *)&__range2);
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base
              ((_Vector_base<Node_*,_std::allocator<Node_*>_> *)&__range2);
    box = local_60;
    node_00 = local_58;
  }
  else {
    ___range2 = **(Box<float> **)box;
    uVar4 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                         *)depth,(Box<float> *)&__range2,(Box<float> *)depth);
    if (uVar4 == 0xffffffff) {
LAB_00101b07:
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)(this + 1),(value_type *)box);
      return;
    }
    this = *(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
             **)(&(this->mBox).left + (ulong)uVar4 * 2);
    ___range2 = computeBox((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                            *)depth,(Box<float> *)(ulong)uVar4,i);
    depth = (size_t)&__range2;
    node_00 = (Node *)((long)&(node->children)._M_elems[0]._M_t.
                              super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                              .
                              super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                      + 1);
  }
  add(this,node_00,depth,box,value);
  return;
}

Assistant:

void add(Node* node, std::size_t depth, const Box<Float>& box, const T& value)
    {
        assert(node != nullptr);
        assert(box.contains(mGetBox(value)));
        if (isLeaf(node))
        {
            // Insert the value in this node if possible
            if (depth >= MaxDepth || node->values.size() < Threshold)
                node->values.push_back(value);
            // Otherwise, we split and we try again
            else
            {
                split(node, box);
                add(node, depth, box, value);
            }
        }
        else
        {
            auto i = getQuadrant(box, mGetBox(value));
            // Add the value in a child if the value is entirely contained in it
            if (i != -1)
                add(node->children[static_cast<std::size_t>(i)].get(), depth + 1, computeBox(box, i), value);
            // Otherwise, we add the value in the current node
            else
                node->values.push_back(value);
        }
    }